

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O3

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  int *piVar6;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> path;
  PosixCommandRunner posix_runner;
  RecursiveInotifyPoller rip;
  optional<InotifyEvent> event;
  PeriodicFilesystemDirtier periodic_dirtier;
  string local_path;
  FilesystemDirt dirt;
  string sync_excludes_str;
  string filter_regex;
  string s3_bucket;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sync_excludes;
  FilteringInotifyPoller fip;
  MultipleCommandRunner multiple_command_runner;
  NonrecursiveInotifyPoller nip;
  undefined1 auStack_103d8 [32];
  bool bStack_103b8;
  ostream *poStack_103b0;
  _func_int **pp_Stack_103a8;
  PosixCommandRunner PStack_103a0;
  RecursiveInotifyPoller RStack_10390;
  _func_int **pp_Stack_10380;
  _func_int **pp_Stack_10378;
  undefined1 auStack_10370 [24];
  undefined1 auStack_10358 [16];
  bool bStack_10348;
  undefined1 auStack_10340 [8];
  _Alloc_hider _Stack_10338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10328;
  duration dStack_10318;
  time_point tStack_10310;
  string sStack_10308;
  FilesystemDirt FStack_102e8;
  AwsCommandRunner AStack_102b0;
  string sStack_10238;
  string sStack_10218;
  string sStack_101f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sStack_101d8;
  FilteringInotifyPoller FStack_101a8;
  MultipleCommandRunner MStack_10178;
  stat sStack_10118;
  NonrecursiveInotifyPoller NStack_10088;
  
  std::__cxx11::string::_M_construct<char_const*>((string *)&NStack_10088,"LOCAL_PATH","");
  GetEnvironmentVariable(&sStack_10308,(string *)&NStack_10088);
  std::__cxx11::string::_M_construct<char_const*>((string *)&NStack_10088,"S3_BUCKET","");
  GetEnvironmentVariable(&sStack_101f8,(string *)&NStack_10088);
  std::__cxx11::string::_M_construct<char_const*>((string *)&NStack_10088,"FILTER_REGEX","");
  GetEnvironmentVariable(&sStack_10218,(string *)&NStack_10088);
  std::__cxx11::string::_M_construct<char_const*>((string *)&NStack_10088,"SYNC_EXCLUDES","");
  GetEnvironmentVariable(&sStack_10238,(string *)&NStack_10088);
  sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header;
  sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sStack_101d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (lVar4 = std::__cxx11::string::find((char)&sStack_10238,0x7c), lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&NStack_10088,(ulong)&sStack_10238);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&sStack_101d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&NStack_10088);
    std::__cxx11::string::erase((ulong)&sStack_10238,0);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sStack_101d8,&sStack_10238);
  pp_Stack_10378 = (_func_int **)&PTR__InotifyPoller_00132d30;
  pp_Stack_10380 = (_func_int **)&PTR__PosixCommandRunner_00132cd0;
  pp_Stack_103a8 = (_func_int **)&PTR__FilteringInotifyPoller_001329b0;
  do {
    NonrecursiveInotifyPoller::NonrecursiveInotifyPoller(&NStack_10088);
    FilteringInotifyPoller::FilteringInotifyPoller
              (&FStack_101a8,&NStack_10088.super_InotifyPoller,&sStack_10218);
    RStack_10390.super_InotifyPoller._vptr_InotifyPoller = pp_Stack_10378;
    RStack_10390.ip_ = &FStack_101a8.super_InotifyPoller;
    bVar1 = RecursiveInotifyPoller::AddWatch(&RStack_10390,&sStack_10308);
    if (!bVar1) {
      __assert_fail("res",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/awssyncer.cc"
                    ,0x5a,
                    "void RunSyncer(const std::string &, const std::string &, const std::string &, const std::set<std::string> &)"
                   );
    }
    FStack_102e8.dirty_ = false;
    FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header;
    FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_10338._M_p = (pointer)&aStack_10328;
    auStack_10340 = (undefined1  [8])&FStack_102e8;
    FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         FStack_102e8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_10338,sStack_10308._M_dataplus._M_p,
               sStack_10308._M_dataplus._M_p + sStack_10308._M_string_length);
    dStack_10318.__r = 21600000000000;
    tStack_10310.__d.__r = (duration)0;
    PStack_103a0.super_CommandRunner._vptr_CommandRunner = pp_Stack_10380;
    PStack_103a0.current_process_ = -1;
    PStack_103a0.previous_command_failed_ = false;
    MStack_10178.command_runner_ = &PStack_103a0.super_CommandRunner;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    MStack_10178.enqueued_commands_.c.
    super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ::_M_initialize_map((_Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
                         *)&MStack_10178.enqueued_commands_,0);
    MStack_10178.ignore_failures_for_current_command_ = false;
    MStack_10178.previous_command_failed_ = false;
    AwsCommandRunner::AwsCommandRunner
              (&AStack_102b0,&MStack_10178,&sStack_10308,&sStack_101f8,&sStack_101d8);
LAB_00116d4b:
    bStack_10348 = false;
    while( true ) {
      (*RStack_10390.super_InotifyPoller._vptr_InotifyPoller[3])(&sStack_10118,&RStack_10390);
      std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::operator=
                ((_Optional_base<InotifyEvent,_true> *)auStack_10370,
                 (_Optional_base<InotifyEvent,_true> *)&sStack_10118);
      bVar1 = bStack_10348;
      if (((char)sStack_10118.st_rdev == '\x01') &&
         ((__mode_t *)sStack_10118.st_ino != &sStack_10118.st_mode)) {
        operator_delete((void *)sStack_10118.st_ino,
                        CONCAT44(sStack_10118.st_uid,sStack_10118.st_mode) + 1);
      }
      if (bVar1 == false) break;
      FilesystemDirt::AddDirtyPath(&FStack_102e8,(string *)(auStack_10370 + 8));
    }
    iVar3 = (*RStack_10390.super_InotifyPoller._vptr_InotifyPoller[4])(&RStack_10390);
    if ((char)iVar3 == '\0') {
      PeriodicFilesystemDirtier::Tick((PeriodicFilesystemDirtier *)auStack_10340);
      bVar2 = AwsCommandRunner::Finished(&AStack_102b0);
      bVar1 = true;
      if (bVar2) {
        bVar2 = AwsCommandRunner::PreviousCommandFailed(&AStack_102b0);
        if (bVar2) {
          poVar5 = Log();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Failed to execute command",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          goto LAB_00116df2;
        }
        FilesystemDirt::ExtractDirtyPath_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_103d8,&FStack_102e8);
        if (bStack_103b8 == true) {
          poStack_103b0 = Log();
          std::__ostream_insert<char,std::char_traits<char>>(poStack_103b0,"Processing path ",0x10);
          poStack_103b0 =
               std::__ostream_insert<char,std::char_traits<char>>
                         (poStack_103b0,(char *)auStack_103d8._0_8_,auStack_103d8._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poStack_103b0 + -0x18) +
                          (char)poStack_103b0);
          std::ostream::put((char)poStack_103b0);
          std::ostream::flush();
          iVar3 = lstat((char *)auStack_103d8._0_8_,&sStack_10118);
          if (iVar3 == 0) {
            if ((sStack_10118.st_mode & 0xf000) == 0x4000) {
              AwsCommandRunner::SyncDirectory(&AStack_102b0,(string *)auStack_103d8);
            }
          }
          else {
            piVar6 = __errno_location();
            if (*piVar6 != 2) {
              poVar5 = Log();
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed to stat ",0xf);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(char *)auStack_103d8._0_8_,auStack_103d8._8_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              if ((bStack_103b8 == true) &&
                 ((undefined1 *)auStack_103d8._0_8_ != auStack_103d8 + 0x10)) {
                operator_delete((void *)auStack_103d8._0_8_,auStack_103d8._16_8_ + 1);
              }
              goto LAB_00116e05;
            }
            AwsCommandRunner::Remove(&AStack_102b0,(string *)auStack_103d8);
          }
        }
        if (((bStack_103b8 & 1U) != 0) &&
           ((undefined1 *)auStack_103d8._0_8_ != auStack_103d8 + 0x10)) {
          operator_delete((void *)auStack_103d8._0_8_,auStack_103d8._16_8_ + 1);
        }
      }
    }
    else {
      poVar5 = Log();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Inotify dropped events",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_00116df2:
      std::ostream::put((char)poVar5);
      std::ostream::flush();
LAB_00116e05:
      bVar1 = false;
    }
    if ((bStack_10348 == true) && ((undefined1 *)auStack_10370._8_8_ != auStack_10358)) {
      operator_delete((void *)auStack_10370._8_8_,auStack_10358._0_8_ + 1);
    }
    if (bVar1) {
      sStack_10118.st_dev = 1;
      sStack_10118.st_ino = 0;
      do {
        iVar3 = nanosleep((timespec *)&sStack_10118,(timespec *)&sStack_10118);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      goto LAB_00116d4b;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&AStack_102b0.sync_excludes_._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)AStack_102b0.s3_bucket_._M_dataplus._M_p != &AStack_102b0.s3_bucket_.field_2) {
      operator_delete(AStack_102b0.s3_bucket_._M_dataplus._M_p,
                      AStack_102b0.s3_bucket_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)AStack_102b0.local_path_._M_dataplus._M_p != &AStack_102b0.local_path_.field_2) {
      operator_delete(AStack_102b0.local_path_._M_dataplus._M_p,
                      AStack_102b0.local_path_.field_2._M_allocated_capacity + 1);
    }
    std::
    deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ::~deque(&MStack_10178.enqueued_commands_.c);
    PosixCommandRunner::~PosixCommandRunner(&PStack_103a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_10338._M_p != &aStack_10328) {
      operator_delete(_Stack_10338._M_p,aStack_10328._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::~_Rb_tree(&FStack_102e8.children_._M_t);
    FStack_101a8.super_InotifyPoller._vptr_InotifyPoller = pp_Stack_103a8;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (&FStack_101a8.regex_);
    NonrecursiveInotifyPoller::~NonrecursiveInotifyPoller(&NStack_10088);
    poVar5 = Log();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Restarting in five seconds",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    do {
      iVar3 = nanosleep((timespec *)&NStack_10088,(timespec *)&NStack_10088);
      if (iVar3 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
  } while( true );
}

Assistant:

int main() {
  // Obtain configuration from environment variables.
  std::string local_path = GetEnvironmentVariable("LOCAL_PATH");
  std::string s3_bucket = GetEnvironmentVariable("S3_BUCKET");
  std::string filter_regex = GetEnvironmentVariable("FILTER_REGEX");
  std::string sync_excludes_str = GetEnvironmentVariable("SYNC_EXCLUDES");

  // Convert single string of globs into a list by splitting on the '|',
  // for example: "*.jpg|*.mp3" -> {"*.jpg", "*.mp3"}.
  std::set<std::string> sync_excludes;
  for (;;) {
    std::size_t split = sync_excludes_str.find('|');
    if (split != std::string::npos) {
      sync_excludes.insert(sync_excludes_str.substr(0, split));
      sync_excludes_str.erase(0, split + 1);
    } else {
      sync_excludes.insert(sync_excludes_str);
      break;
    }
  }

  // Keep on running indefinitely, restarting if an error occurred. Put a pause
  // of a couple of seconds in between, so that we never perform any actions in
  // a tight loop.
  for (;;) {
    RunSyncer(local_path, s3_bucket, filter_regex, sync_excludes);
    Log() << "Restarting in five seconds" << std::endl;
    std::this_thread::sleep_for(std::chrono::seconds(5));
  }
}